

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O2

void __thiscall
NJamSpell::TSpellCorrector::Inserts2(TSpellCorrector *this,wstring *w,TWords *result)

{
  TBloomFilter *this_00;
  bool bVar1;
  unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  *puVar2;
  __node_base *p_Var3;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d0;
  undefined1 local_b0 [8];
  wstring s;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_70;
  wstring *local_50;
  TWords *local_48;
  ulong local_40;
  TSpellCorrector *local_38;
  
  local_50 = w;
  local_48 = result;
  local_38 = this;
  for (local_40 = 0; local_40 < w->_M_string_length + 1; local_40 = local_40 + 1) {
    puVar2 = TLangModel::GetAlphabet(&local_38->LangModel);
    p_Var3 = &(puVar2->_M_h)._M_before_begin;
    while( true ) {
      p_Var3 = p_Var3->_M_nxt;
      if (p_Var3 == (__node_base *)0x0) break;
      std::__cxx11::wstring::substr((ulong)(&s.field_2._M_allocated_capacity + 1),(ulong)w);
      std::operator+(&local_70,
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     (&s.field_2._M_allocated_capacity + 1),(wchar_t)*(size_type *)(p_Var3 + 1));
      std::__cxx11::wstring::substr((ulong)&local_d0,(ulong)w);
      std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     local_b0,&local_70,&local_d0);
      std::__cxx11::wstring::~wstring((wstring *)&local_d0);
      std::__cxx11::wstring::~wstring((wstring *)&local_70);
      std::__cxx11::wstring::~wstring((wstring *)((long)&s.field_2 + 8));
      this_00 = (local_38->Deletes1)._M_t.
                super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                ._M_t.
                super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl;
      WideToUTF8((string *)&local_70,
                 (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 local_b0);
      bVar1 = TBloomFilter::Contains(this_00,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar1) {
        Inserts(local_38,(wstring *)local_b0,local_48);
      }
      std::__cxx11::wstring::~wstring((wstring *)local_b0);
      w = local_50;
    }
  }
  return;
}

Assistant:

void TSpellCorrector::Inserts2(const std::wstring& w, TWords& result) const {
    for (size_t i = 0; i < w.size() + 1; ++i) {
        for (auto&& ch: LangModel.GetAlphabet()) {
            std::wstring s = w.substr(0, i) + ch + w.substr(i);
            if (Deletes1->Contains(WideToUTF8(s))) {
                Inserts(s, result);
            }
        }
    }
}